

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

roaring_bitmap_t *
roaring_bitmap_lazy_or(roaring_bitmap_t *x1,roaring_bitmap_t *x2,_Bool bitsetconversion)

{
  ushort key;
  container_t *c2;
  _Bool _Var1;
  uint end_index;
  container_t *pcVar2;
  array_container_t *paVar3;
  array_container_t *paVar4;
  array_container_t *paVar5;
  ushort *puVar6;
  run_container_t *dst;
  roaring_bitmap_t *prVar7;
  byte bVar8;
  uint8_t uVar9;
  uint uVar10;
  byte bVar11;
  undefined7 in_register_00000011;
  uint uVar12;
  array_container_t *paVar13;
  roaring_array_t *ra;
  uint uVar14;
  uint16_t key_00;
  roaring_array_t *ra_00;
  uint8_t result_type;
  uint8_t type1;
  uint local_80;
  uint8_t type2;
  byte local_7a;
  byte local_79;
  roaring_array_t *local_78;
  array_container_t *local_70;
  array_container_t *local_68;
  ulong local_60;
  roaring_array_t *local_58;
  ulong local_50;
  roaring_array_t *local_48;
  undefined4 local_3c;
  array_container_t *local_38;
  uint uVar15;
  
  result_type = '\0';
  uVar15 = (x1->high_low_container).size;
  prVar7 = x2;
  if (uVar15 != 0) {
    uVar14 = (x2->high_low_container).size;
    local_60 = (ulong)uVar14;
    prVar7 = x1;
    if (uVar14 != 0) {
      local_3c = (undefined4)CONCAT71(in_register_00000011,bitsetconversion);
      local_58 = &roaring_bitmap_create_with_capacity(uVar14 + uVar15)->high_low_container;
      local_80 = 0;
      bVar11 = 0;
      if (((x1->high_low_container).flags & 1) != 0) {
        bVar11 = (x2->high_low_container).flags & 1;
      }
      local_58->flags = local_58->flags & 0xfe | bVar11;
      puVar6 = (x1->high_low_container).keys;
      key_00 = *(x2->high_low_container).keys;
      uVar14 = 0;
      local_78 = &x2->high_low_container;
      local_50 = (ulong)uVar15;
      local_48 = &x1->high_low_container;
LAB_00110344:
      do {
        key = *puVar6;
        uVar15 = uVar14;
        while( true ) {
          ra = local_48;
          ra_00 = local_58;
          uVar12 = local_80;
          uVar14 = uVar15 + 1;
          if (key == key_00) break;
          if (key < key_00) {
            type1 = local_48->typecodes[local_80 & 0xffff];
            paVar5 = (array_container_t *)
                     get_copy_of_container
                               (local_48->containers[local_80 & 0xffff],&type1,
                                (_Bool)(local_48->flags & 1));
            uVar9 = type1;
            if ((ra->flags & 1) != 0) {
              local_68 = (array_container_t *)CONCAT44(local_68._4_4_,(uint)type1);
              local_70 = paVar5;
              ra_set_container_at_index(ra,uVar12,paVar5,type1);
              uVar9 = (uint8_t)local_68;
              paVar5 = local_70;
            }
            ra_append(local_58,key,paVar5,uVar9);
            uVar12 = uVar12 + 1;
            x2 = (roaring_bitmap_t *)local_78;
            if (uVar12 == (uint)local_50) {
              ra_00 = local_58;
              uVar10 = (uint)local_60;
              goto LAB_00110787;
            }
            puVar6 = (ushort *)((ulong)((uVar12 & 0xffff) * 2) + (long)ra->keys);
            uVar14 = uVar15;
            local_80 = uVar12;
            goto LAB_00110344;
          }
          type2 = (x2->high_low_container).typecodes[(ulong)uVar15 & 0xffff];
          pcVar2 = get_copy_of_container
                             ((x2->high_low_container).containers[(ulong)uVar15 & 0xffff],&type2,
                              (_Bool)((x2->high_low_container).flags & 1));
          uVar9 = type2;
          if (((x2->high_low_container).flags & 1) != 0) {
            ra_set_container_at_index(local_78,uVar15,pcVar2,type2);
          }
          ra_00 = local_58;
          ra_append(local_58,key_00,pcVar2,uVar9);
          uVar10 = (uint)local_60;
          x2 = (roaring_bitmap_t *)local_78;
          if (uVar10 == uVar14) {
            end_index = (uint)local_50;
            ra = local_48;
            uVar14 = uVar10;
            uVar12 = local_80;
            goto LAB_00110783;
          }
          key_00 = local_78->keys[uVar14 & 0xffff];
          uVar15 = uVar14;
        }
        type1 = local_48->typecodes[local_80 & 0xffff];
        pcVar2 = local_48->containers[local_80 & 0xffff];
        bVar11 = (x2->high_low_container).typecodes[uVar15 & 0xffff];
        c2 = (x2->high_low_container).containers[uVar15 & 0xffff];
        type2 = bVar11;
        if ((char)local_3c != '\0') {
          bVar8 = type1;
          if (type1 == 4) {
            bVar8 = *(byte *)((long)pcVar2 + 8);
          }
          if (bVar8 == 1) goto LAB_00110452;
          bVar8 = bVar11;
          if (bVar11 == 4) {
            bVar8 = *(byte *)((long)c2 + 8);
          }
          if (bVar8 == 1) goto LAB_00110452;
          pcVar2 = container_mutable_unwrap_shared(pcVar2,&type1);
          local_70 = (array_container_t *)container_to_bitset(pcVar2,type1);
          type1 = '\x01';
          paVar5 = (array_container_t *)container_lazy_ior(local_70,'\x01',c2,bVar11,&result_type);
          uVar12 = local_80;
          if (paVar5 != local_70) {
            container_free(local_70,'\x01');
            uVar12 = local_80;
          }
          goto LAB_0011069e;
        }
LAB_00110452:
        local_7a = bVar11;
        local_79 = type1;
        paVar3 = (array_container_t *)container_unwrap_shared(pcVar2,&local_79);
        paVar4 = (array_container_t *)container_unwrap_shared(c2,&local_7a);
        local_38 = (array_container_t *)0x0;
        switch((uint)local_7a + (uint)local_79 * 4) {
        case 5:
          paVar5 = (array_container_t *)bitset_container_create();
          bitset_container_or_nocard
                    ((bitset_container_t *)paVar3,(bitset_container_t *)paVar4,
                     (bitset_container_t *)paVar5);
          goto LAB_0011068d;
        case 6:
          paVar5 = (array_container_t *)bitset_container_create();
          paVar13 = paVar3;
          goto LAB_00110685;
        case 7:
          _Var1 = run_container_is_full((run_container_t *)paVar4);
          uVar12 = local_80;
          if (!_Var1) {
            local_70 = paVar4;
            paVar5 = (array_container_t *)bitset_container_create();
            paVar4 = local_70;
            goto LAB_0011074e;
          }
          local_70 = paVar4;
          paVar5 = (array_container_t *)run_container_create();
          paVar3 = local_70;
LAB_0011071d:
          result_type = '\x03';
          run_container_copy((run_container_t *)paVar3,(run_container_t *)paVar5);
          break;
        default:
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x14e3,
                        "container_t *container_lazy_or(const container_t *, uint8_t, const container_t *, uint8_t, uint8_t *)"
                       );
        case 9:
          paVar5 = (array_container_t *)bitset_container_create();
          paVar13 = paVar4;
          paVar4 = paVar3;
LAB_00110685:
          array_bitset_container_lazy_union
                    (paVar4,(bitset_container_t *)paVar13,(bitset_container_t *)paVar5);
LAB_0011068d:
          result_type = '\x01';
          uVar12 = local_80;
          break;
        case 10:
          _Var1 = array_array_container_lazy_union(paVar3,paVar4,&local_38);
          result_type = '\x02' - _Var1;
          paVar5 = local_38;
          uVar12 = local_80;
          break;
        case 0xb:
          paVar5 = (array_container_t *)run_container_create();
          paVar13 = paVar4;
          goto LAB_00110655;
        case 0xd:
          local_70 = paVar4;
          _Var1 = run_container_is_full((run_container_t *)paVar3);
          uVar12 = local_80;
          local_68 = paVar3;
          if (_Var1) {
            paVar5 = (array_container_t *)run_container_create();
            paVar3 = local_68;
            goto LAB_0011071d;
          }
          paVar5 = (array_container_t *)bitset_container_create();
          paVar3 = local_70;
          paVar4 = local_68;
LAB_0011074e:
          run_bitset_container_lazy_union
                    ((run_container_t *)paVar4,(bitset_container_t *)paVar3,
                     (bitset_container_t *)paVar5);
          result_type = '\x01';
          break;
        case 0xe:
          paVar5 = (array_container_t *)run_container_create();
          paVar13 = paVar3;
          paVar3 = paVar4;
LAB_00110655:
          array_run_container_union(paVar3,(run_container_t *)paVar13,(run_container_t *)paVar5);
          result_type = '\x03';
          uVar12 = local_80;
          break;
        case 0xf:
          dst = run_container_create();
          run_container_union((run_container_t *)paVar3,(run_container_t *)paVar4,dst);
          result_type = '\x03';
          paVar5 = (array_container_t *)convert_run_to_efficient_container(dst,&result_type);
          uVar12 = local_80;
        }
LAB_0011069e:
        x2 = (roaring_bitmap_t *)local_78;
        ra_append(ra_00,key,paVar5,result_type);
        uVar12 = uVar12 + 1;
        end_index = (uint)local_50;
        uVar10 = (uint)local_60;
        if ((uVar12 == end_index) || (uVar10 == uVar14)) {
LAB_00110783:
          uVar15 = uVar14;
          if (uVar12 == end_index) {
LAB_00110787:
            end_index = uVar10;
            bVar11 = (x2->high_low_container).flags;
            ra = &x2->high_low_container;
            uVar12 = uVar15;
          }
          else {
            if (uVar14 != uVar10) {
              return (roaring_bitmap_t *)ra_00;
            }
            bVar11 = ra->flags;
          }
          ra_append_copy_range(ra_00,ra,uVar12,end_index,(_Bool)(bVar11 & 1));
          return (roaring_bitmap_t *)ra_00;
        }
        puVar6 = (ushort *)((ulong)((uVar12 & 0xffff) * 2) + (long)ra->keys);
        key_00 = (x2->high_low_container).keys[uVar14 & 0xffff];
        local_80 = uVar12;
      } while( true );
    }
  }
  prVar7 = roaring_bitmap_copy(prVar7);
  return prVar7;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_lazy_or(const roaring_bitmap_t *x1,
                                         const roaring_bitmap_t *x2,
                                         const bool bitsetconversion) {
    uint8_t result_type = 0;
    const int length1 = x1->high_low_container.size,
              length2 = x2->high_low_container.size;
    if (0 == length1) {
        return roaring_bitmap_copy(x2);
    }
    if (0 == length2) {
        return roaring_bitmap_copy(x1);
    }
    roaring_bitmap_t *answer =
        roaring_bitmap_create_with_capacity(length1 + length2);
    roaring_bitmap_set_copy_on_write(answer, is_cow(x1) && is_cow(x2));
    int pos1 = 0, pos2 = 0;
    uint8_t type1, type2;
    uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, pos1);
    uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, pos2);
    while (true) {
        if (s1 == s2) {
            container_t *c1 = ra_get_container_at_index(
                                    &x1->high_low_container, pos1, &type1);
            container_t *c2 = ra_get_container_at_index(
                                    &x2->high_low_container, pos2, &type2);
            container_t *c;
            if (bitsetconversion &&
                (get_container_type(c1, type1) != BITSET_CONTAINER_TYPE) &&
                (get_container_type(c2, type2) != BITSET_CONTAINER_TYPE)
            ){
                container_t *newc1 =
                    container_mutable_unwrap_shared(c1, &type1);
                newc1 = container_to_bitset(newc1, type1);
                type1 = BITSET_CONTAINER_TYPE;
                c = container_lazy_ior(newc1, type1, c2, type2,
                                       &result_type);
                if (c != newc1) {  // should not happen
                    container_free(newc1, type1);
                }
            } else {
                c = container_lazy_or(c1, type1, c2, type2, &result_type);
            }
            // since we assume that the initial containers are non-empty,
            // the
            // result here
            // can only be non-empty
            ra_append(&answer->high_low_container, s1, c, result_type);
            ++pos1;
            ++pos2;
            if (pos1 == length1) break;
            if (pos2 == length2) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, pos1);
            s2 = ra_get_key_at_index(&x2->high_low_container, pos2);

        } else if (s1 < s2) {  // s1 < s2
            container_t *c1 = ra_get_container_at_index(
                                    &x1->high_low_container, pos1, &type1);
            c1 = get_copy_of_container(c1, &type1, is_cow(x1));
            if (is_cow(x1)) {
                ra_set_container_at_index(&x1->high_low_container, pos1, c1,
                                          type1);
            }
            ra_append(&answer->high_low_container, s1, c1, type1);
            pos1++;
            if (pos1 == length1) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, pos1);

        } else {  // s1 > s2
            container_t *c2 = ra_get_container_at_index(
                                    &x2->high_low_container, pos2, &type2);
            c2 = get_copy_of_container(c2, &type2, is_cow(x2));
            if (is_cow(x2)) {
                ra_set_container_at_index(&x2->high_low_container, pos2, c2,
                                          type2);
            }
            ra_append(&answer->high_low_container, s2, c2, type2);
            pos2++;
            if (pos2 == length2) break;
            s2 = ra_get_key_at_index(&x2->high_low_container, pos2);
        }
    }
    if (pos1 == length1) {
        ra_append_copy_range(&answer->high_low_container,
                             &x2->high_low_container, pos2, length2,
                             is_cow(x2));
    } else if (pos2 == length2) {
        ra_append_copy_range(&answer->high_low_container,
                             &x1->high_low_container, pos1, length1,
                             is_cow(x1));
    }
    return answer;
}